

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiMultiSelectState * __thiscall
ImPool<ImGuiMultiSelectState>::Add(ImPool<ImGuiMultiSelectState> *this)

{
  int iVar1;
  ImGuiSelectionUserData *pIVar2;
  int iVar3;
  int iVar4;
  ImGuiMultiSelectState *pIVar5;
  ImGuiMultiSelectState *pIVar6;
  int iVar7;
  
  iVar3 = this->FreeIdx;
  iVar7 = (this->Buf).Size;
  if (iVar3 == iVar7) {
    iVar1 = iVar7 + 1;
    iVar4 = (this->Buf).Capacity;
    if (iVar4 <= iVar7) {
      if (iVar4 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar4 / 2 + iVar4;
      }
      if (iVar7 <= iVar1) {
        iVar7 = iVar1;
      }
      if (iVar4 < iVar7) {
        pIVar6 = (ImGuiMultiSelectState *)ImGui::MemAlloc((long)iVar7 * 0x28);
        pIVar5 = (this->Buf).Data;
        if (pIVar5 != (ImGuiMultiSelectState *)0x0) {
          memcpy(pIVar6,pIVar5,(long)(this->Buf).Size * 0x28);
          ImGui::MemFree((this->Buf).Data);
        }
        (this->Buf).Data = pIVar6;
        (this->Buf).Capacity = iVar7;
      }
    }
    (this->Buf).Size = iVar1;
    iVar7 = this->FreeIdx + 1;
  }
  else {
    iVar7 = *(int *)&(this->Buf).Data[iVar3].Window;
  }
  this->FreeIdx = iVar7;
  pIVar6 = (this->Buf).Data;
  pIVar5 = pIVar6 + iVar3;
  pIVar5->Window = (ImGuiWindow *)0x0;
  pIVar5->ID = 0;
  pIVar5->LastFrameActive = 0;
  pIVar6[iVar3].LastSelectionSize = 0;
  pIVar6[iVar3].RangeSelected = -1;
  pIVar6[iVar3].NavIdSelected = -1;
  pIVar2 = &pIVar6[iVar3].RangeSrcItem;
  *(undefined4 *)pIVar2 = 0xffffffff;
  *(undefined4 *)((long)pIVar2 + 4) = 0xffffffff;
  *(undefined4 *)(pIVar2 + 1) = 0xffffffff;
  *(undefined4 *)((long)pIVar2 + 0xc) = 0xffffffff;
  this->AliveCount = this->AliveCount + 1;
  return (this->Buf).Data + iVar3;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }